

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O0

void __thiscall
VC1StreamReader::updateStreamFps
          (VC1StreamReader *this,void *nalUnit,uint8_t *buff,uint8_t *nextNal,int oldSpsLen)

{
  uint8_t *dst;
  size_t __n;
  int64_t sizeDiff;
  int64_t newSpsLen;
  uint8_t *tmpBuffer;
  int oldSpsLen_local;
  uint8_t *nextNal_local;
  uint8_t *buff_local;
  void *nalUnit_local;
  VC1StreamReader *this_local;
  
  VC1SequenceHeader::setFPS(&this->m_sequence,(this->super_MPEGStreamReader).m_fps);
  dst = (uint8_t *)operator_new__((long)(oldSpsLen + 0x10));
  __n = VC1Unit::vc1_escape_buffer(&(this->m_sequence).super_VC1Unit,dst);
  if (__n != (long)oldSpsLen) {
    memmove(nextNal + (__n - (long)oldSpsLen),nextNal,
            (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)nextNal
           );
    (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd =
         (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd +
         (__n - (long)oldSpsLen);
  }
  memcpy(buff + 1,dst,__n);
  if (dst != (uint8_t *)0x0) {
    operator_delete__(dst);
  }
  return;
}

Assistant:

void VC1StreamReader::updateStreamFps(void* nalUnit, uint8_t* buff, uint8_t* nextNal, const int oldSpsLen)
{
    m_sequence.setFPS(m_fps);
    const auto tmpBuffer = new uint8_t[oldSpsLen + 16];
    const int64_t newSpsLen = m_sequence.vc1_escape_buffer(tmpBuffer);
    if (newSpsLen != oldSpsLen)
    {
        const int64_t sizeDiff = newSpsLen - oldSpsLen;
        memmove(nextNal + sizeDiff, nextNal, m_bufEnd - nextNal);
        m_bufEnd += sizeDiff;
    }
    memcpy(buff + 1, tmpBuffer, newSpsLen);
    delete[] tmpBuffer;
}